

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::TimerImpl::Impl> kj::heap<kj::TimerImpl::Impl>(void)

{
  _func_int **pp_Var1;
  Impl *extraout_RDX;
  Disposer *in_RDI;
  Own<kj::TimerImpl::Impl> OVar2;
  
  pp_Var1 = (_func_int **)operator_new(0x30);
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)0x0;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)(pp_Var1 + 1);
  pp_Var1[4] = (_func_int *)(pp_Var1 + 1);
  pp_Var1[5] = (_func_int *)0x0;
  in_RDI->_vptr_Disposer = (_func_int **)&_::HeapDisposer<kj::TimerImpl::Impl>::instance;
  in_RDI[1]._vptr_Disposer = pp_Var1;
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = in_RDI;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}